

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::optional<pbrt::Interaction>::optional
          (optional<pbrt::Interaction> *this,optional<pbrt::Interaction> *v)

{
  bool bVar1;
  Interval IVar2;
  Interval IVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Interaction *pIVar9;
  
  bVar1 = v->set;
  this->set = bVar1;
  if (bVar1 == true) {
    pIVar9 = value(v);
    IVar2 = (pIVar9->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
    IVar3 = (pIVar9->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
    uVar4 = *(undefined8 *)&pIVar9->time;
    uVar5 = *(undefined8 *)&(pIVar9->wo).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar6 = *(undefined8 *)&(pIVar9->n).super_Tuple3<pbrt::Normal3,_float>;
    uVar7 = *(undefined8 *)&(pIVar9->n).super_Tuple3<pbrt::Normal3,_float>.z;
    uVar8 = *(undefined8 *)&(pIVar9->uv).super_Tuple2<pbrt::Point2,_float>.y;
    (this->optionalValue).__align =
         (anon_struct_8_0_00000001_for___align)
         (pIVar9->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
    *(Interval *)((long)&this->optionalValue + 8) = IVar2;
    *(Interval *)((long)&this->optionalValue + 0x10) = IVar3;
    *(undefined8 *)((long)&this->optionalValue + 0x18) = uVar4;
    *(undefined8 *)((long)&this->optionalValue + 0x20) = uVar5;
    *(undefined8 *)((long)&this->optionalValue + 0x28) = uVar6;
    *(undefined8 *)((long)&this->optionalValue + 0x30) = uVar7;
    *(undefined8 *)((long)&this->optionalValue + 0x38) = uVar8;
    *(MediumInterface **)((long)&this->optionalValue + 0x40) = pIVar9->mediumInterface;
    *(undefined8 *)((long)&this->optionalValue + 0x48) = 0;
    *(uintptr_t *)((long)&this->optionalValue + 0x48) =
         (pIVar9->medium).
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
         .bits;
    reset(v);
    return;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    bool has_value() const { return set; }